

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O1

void despot::DisableBufferedIO(void)

{
  setbuf(_stdout,(char *)0x0);
  setbuf(_stdin,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  setvbuf(_stdout,(char *)0x0,2,0);
  setvbuf(_stdin,(char *)0x0,2,0);
  setvbuf(_stderr,(char *)0x0,2,0);
  return;
}

Assistant:

void DisableBufferedIO(void) {
	setbuf(stdout, NULL);
	setbuf(stdin, NULL);
	setbuf(stderr, NULL);
	setvbuf(stdout, NULL, _IONBF, 0);
	setvbuf(stdin, NULL, _IONBF, 0);
	setvbuf(stderr, NULL, _IONBF, 0);
}